

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

int __thiscall
pbrt::PtexTextureBase::SampleTexture(PtexTextureBase *this,TextureEvalContext ctx,float *result)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined1 auVar3 [16];
  long *plVar4;
  int c;
  uint uVar5;
  PtexTexture *tex;
  PtexFilter *pPVar6;
  ulong uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  span<const_unsigned_char> vin;
  span<float> vout;
  uint8_t result8 [3];
  Float fResult [3];
  String error;
  Options opts;
  
  plVar4 = cache;
  if (this->valid == false) {
    *result = 0.0;
    uVar5 = 1;
  }
  else {
    error._M_dataplus._M_p = (pointer)&error.field_2;
    *(long *)(in_FS_OFFSET + -0x1c0) = *(long *)(in_FS_OFFSET + -0x1c0) + 1;
    error._M_string_length = 0;
    error.field_2._M_local_buf[0] = '\0';
    tex = (PtexTexture *)
          (**(code **)(*plVar4 + 0x28))(plVar4,(this->filename)._M_dataplus._M_p,&error);
    if (tex == (PtexTexture *)0x0) {
      LogFatal<char_const(&)[19]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/textures.cpp"
                 ,0x253,"Check failed: %s",(char (*) [19])"texture != nullptr");
    }
    opts.__structSize = 0x14;
    opts.filter = f_bspline;
    opts.lerp = false;
    opts.sharpness = 0.0;
    opts.noedgeblend = false;
    pPVar6 = Ptex::v2_2::PtexFilter::getFilter(tex,&opts);
    uVar5 = (*tex->_vptr_PtexTexture[0xb])(tex);
    (*pPVar6->_vptr_PtexFilter[3])
              ((ulong)(uint)ctx.uv.super_Tuple2<pbrt::Point2,_float>.x,
               (ulong)(uint)ctx.uv.super_Tuple2<pbrt::Point2,_float>.y,(ulong)(uint)ctx.dudx,
               (ulong)(uint)ctx.dvdx,(ulong)(uint)ctx.dudy,(ulong)(uint)ctx.dvdy,
               SUB648(ZEXT464(0x3f800000),0),0,pPVar6,result,0,(ulong)uVar5,
               (ulong)(uint)ctx.faceIndex);
    (*pPVar6->_vptr_PtexFilter[2])(pPVar6);
    (*tex->_vptr_PtexTexture[2])(tex);
    if ((this->encoding).
        super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
        .bits != ColorEncodingHandle::Linear) {
      uVar8 = (ulong)(~((int)uVar5 >> 0x1f) & uVar5);
      for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
        auVar3 = vfmadd132ss_fma(ZEXT416((uint)result[uVar7]),SUB6416(ZEXT464(0x3f000000),0),
                                 SUB6416(ZEXT464(0x437f0000),0));
        auVar1 = vminss_avx(SUB6416(ZEXT464(0x437f0000),0),auVar3);
        uVar2 = vcmpss_avx512f(auVar3,ZEXT816(0) << 0x40,1);
        result8[uVar7] = (uint8_t)(int)(float)((uint)!(bool)((byte)uVar2 & 1) * auVar1._0_4_);
      }
      vin.n = (size_t)(int)uVar5;
      vin.ptr = result8;
      vout.n = vin.n;
      vout.ptr = fResult;
      ColorEncodingHandle::ToLinear(&this->encoding,vin,vout);
      for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
        result[uVar7] = fResult[uVar7];
      }
    }
    std::__cxx11::string::~string((string *)&error);
  }
  return uVar5;
}

Assistant:

int PtexTextureBase::SampleTexture(TextureEvalContext ctx, float result[3]) const {
    if (!valid) {
        result[0] = 0.;
        return 1;
    }

    ++nLookups;
    Ptex::String error;
    Ptex::PtexTexture *texture = cache->get(filename.c_str(), error);
    CHECK(texture != nullptr);
    // TODO: make the filter an option?
    Ptex::PtexFilter::Options opts(Ptex::PtexFilter::FilterType::f_bspline);
    Ptex::PtexFilter *filter = Ptex::PtexFilter::getFilter(texture, opts);
    int nc = texture->numChannels();

    int firstChan = 0;
    filter->eval(result, firstChan, nc, ctx.faceIndex, ctx.uv[0], ctx.uv[1], ctx.dudx,
                 ctx.dvdx, ctx.dudy, ctx.dvdy);
    filter->release();
    texture->release();

    if (encoding != ColorEncodingHandle::Linear) {
        // It feels a little dirty to convert to 8-bits to run through the
        // encoding, but it's probably fine.
        uint8_t result8[3];
        for (int i = 0; i < nc; ++i)
            result8[i] = uint8_t(Clamp(result[i] * 255.f + 0.5f, 0, 255));

        // Handle Float == double.
        Float fResult[3];
        encoding.ToLinear(pstd::MakeConstSpan(result8, nc), pstd::MakeSpan(fResult, nc));
        for (int c = 0; c < nc; ++c)
            result[c] = fResult[c];
    }

    return nc;
}